

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O1

void __thiscall NutFunction::GenerateBodySource(NutFunction *this,int n,ostream *out)

{
  pointer pLVar1;
  uint uVar2;
  pointer pLVar3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pIVar5;
  pointer pLVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  ostream oVar8;
  long *plVar9;
  ostream *poVar10;
  LocalVariableExpression *__p;
  ExpressionPtr *pEVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  pointer pOVar15;
  pointer pLVar16;
  pointer pLVar17;
  ulong uVar18;
  char *pcVar19;
  char cVar20;
  pointer obj;
  bool bVar21;
  VMState state;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  VMState local_98;
  
  cVar20 = (char)out;
  if (this->m_IsGenerator == true) {
    iVar13 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar20);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Function is a generator.",0x1b);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
    std::ostream::put(cVar20);
    std::ostream::flush();
  }
  if (g_DebugMode == true) {
    iVar13 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar20);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Defaults:",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
    std::ostream::put(cVar20);
    std::ostream::flush();
    piVar14 = (this->m_DefaultParams).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (piVar14 !=
        (this->m_DefaultParams).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        iVar13 = n;
        if (0 < n) {
          do {
            std::ostream::put(cVar20);
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"//\t",3);
        plVar9 = (long *)std::ostream::operator<<((ostream *)out,*piVar14);
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
        piVar14 = piVar14 + 1;
      } while (piVar14 !=
               (this->m_DefaultParams).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
    std::ostream::put(cVar20);
    std::ostream::flush();
    iVar13 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar20);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Literals:",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
    std::ostream::put(cVar20);
    std::ostream::flush();
    obj = (this->m_Literals).super__Vector_base<SqObject,_std::allocator<SqObject>_>._M_impl.
          super__Vector_impl_data._M_start;
    if (obj != (this->m_Literals).super__Vector_base<SqObject,_std::allocator<SqObject>_>._M_impl.
               super__Vector_impl_data._M_finish) {
      do {
        iVar13 = n;
        if (0 < n) {
          do {
            std::ostream::put(cVar20);
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"//\t",3);
        poVar10 = operator<<(out,obj);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        obj = obj + 1;
      } while (obj != (this->m_Literals).super__Vector_base<SqObject,_std::allocator<SqObject>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
    std::ostream::put(cVar20);
    std::ostream::flush();
    iVar13 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar20);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Outer values:",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
    std::ostream::put(cVar20);
    std::ostream::flush();
    pOVar15 = (this->m_OuterValues).
              super__Vector_base<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pOVar15 !=
        (this->m_OuterValues).
        super__Vector_base<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        iVar13 = n;
        if (0 < n) {
          do {
            std::ostream::put(cVar20);
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"//\t",3);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)out,pOVar15->type);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  src=",6);
        poVar10 = operator<<(poVar10,&pOVar15->src);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  name=",7);
        poVar10 = operator<<(poVar10,&pOVar15->name);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pOVar15 = pOVar15 + 1;
      } while (pOVar15 !=
               (this->m_OuterValues).
               super__Vector_base<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
    std::ostream::put(cVar20);
    std::ostream::flush();
    iVar13 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar20);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Local identifiers:",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
    std::ostream::put(cVar20);
    std::ostream::flush();
    pLVar17 = (this->m_Locals).
              super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar17 !=
        (this->m_Locals).
        super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      do {
        iVar13 = n;
        if (0 < n) {
          do {
            std::ostream::put(cVar20);
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"//   -",6);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (out,pLVar17[-1].name._M_dataplus._M_p,pLVar17[-1].name._M_string_length
                            );
        iVar13 = (int)pLVar17[-1].name._M_string_length;
        if (0 < 10 - iVar13) {
          iVar13 = iVar13 + -10;
          do {
            std::ostream::put((char)poVar10);
            iVar13 = iVar13 + 1;
          } while (iVar13 != 0);
        }
        pLVar1 = pLVar17 + -1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," // pos=",8);
        poVar10 = std::ostream::_M_insert<long>((long)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  start=",8);
        poVar10 = std::ostream::_M_insert<long>((long)poVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  end=",6);
        poVar10 = std::ostream::_M_insert<long>((long)poVar10);
        bVar21 = pLVar17[-1].foreachLoopState != false;
        pcVar19 = "";
        if (bVar21) {
          pcVar19 = " foreach state";
        }
        lVar12 = 0;
        if (bVar21) {
          lVar12 = 0xe;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar19,lVar12);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pLVar17 = pLVar1;
      } while (pLVar1 != (this->m_Locals).
                         super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
    std::ostream::put(cVar20);
    std::ostream::flush();
    iVar13 = n;
    if (0 < n) {
      do {
        std::ostream::put(cVar20);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Instructions:",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
    std::ostream::put(cVar20);
    std::ostream::flush();
    if ((this->m_Instructions).
        super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->m_Instructions).
        super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pLVar16 = (this->m_LineInfos).
                super__Vector_base<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar18 = 0;
      do {
        pLVar3 = (this->m_LineInfos).
                 super__Vector_base<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pLVar16 != pLVar3) {
          uVar2 = (uint)pLVar16->op;
          pLVar6 = pLVar16;
          while ((pLVar16 = pLVar6, uVar2 <= uVar18 && (pLVar16 = pLVar6 + 1, pLVar16 != pLVar3))) {
            uVar2 = (uint)pLVar6[1].op;
            pLVar6 = pLVar16;
          }
        }
        iVar13 = n;
        if (0 < n) {
          do {
            std::ostream::put(cVar20);
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"// ",3);
        poVar10 = out + *(long *)(*(long *)out + -0x18);
        if (out[*(long *)(*(long *)out + -0x18) + 0xe1] == (ostream)0x0) {
          oVar8 = (ostream)std::ios::widen((char)poVar10);
          poVar10[0xe0] = oVar8;
          poVar10[0xe1] = (ostream)0x1;
        }
        poVar10[0xe0] = (ostream)0x20;
        *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 5;
        poVar10 = std::ostream::_M_insert<long>((long)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
        PrintOpcode(this,out,(int)uVar18,
                    (this->m_Instructions).
                    super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar18);
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
        std::ostream::put(cVar20);
        std::ostream::flush();
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)(this->m_Instructions).
                                      super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_Instructions).
                                      super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    iVar13 = n;
    if (n < 1) {
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
      std::ostream::put(cVar20);
      std::ostream::flush();
    }
    else {
      do {
        std::ostream::put(cVar20);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
      std::ostream::put(cVar20);
      std::ostream::flush();
      iVar13 = n;
      if (0 < n) {
        do {
          std::ostream::put(cVar20);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"// Decompilation attempt:",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar20);
    std::ostream::put(cVar20);
    std::ostream::flush();
  }
  VMState::VMState(&local_98,this,this->m_StackSize);
  pLVar17 = (this->m_Locals).
            super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar17 !=
      (this->m_Locals).
      super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    do {
      if ((pLVar17[-1].start_op == 0) && (pLVar17[-1].foreachLoopState == false)) {
        __p = (LocalVariableExpression *)operator_new(0x28);
        (__p->super_VariableExpression).super_Expression._vptr_Expression =
             (_func_int **)&PTR_GetType_0012c860;
        (__p->super_VariableExpression).m_name._M_dataplus._M_p =
             (pointer)&(__p->super_VariableExpression).m_name.field_2;
        pcVar4 = pLVar17[-1].name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(__p->super_VariableExpression).m_name,pcVar4,
                   pcVar4 + pLVar17[-1].name._M_string_length);
        (__p->super_VariableExpression).super_Expression._vptr_Expression =
             (_func_int **)&PTR_GetType_0012cf88;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<LocalVariableExpression*>
                  (&_Stack_a0,__p);
        pEVar11 = VMState::AtStack(&local_98,pLVar17[-1].pos);
        _Var7._M_pi = _Stack_a0._M_pi;
        _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (pEVar11->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                  _M_pi;
        (pEVar11->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)__p;
        (pEVar11->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             _Var7._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
        }
      }
      pLVar17 = pLVar17 + -1;
    } while (pLVar17 !=
             (this->m_Locals).
             super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.m_IP <
      (int)((ulong)((long)((local_98.m_Parent)->m_Instructions).
                          super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)((local_98.m_Parent)->m_Instructions).
                         super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    do {
      lVar12 = (long)local_98.m_IP;
      pIVar5 = (this->m_Instructions).
               super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((pIVar5[lVar12].op == '\x13') &&
          (((long)(this->m_Instructions).
                  super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar5 >> 3) + -1 == lVar12))
         && (pIVar5[lVar12].arg0 == -1)) {
        VMState::NextInstruction(&local_98);
      }
      else {
        DecompileStatement(this,&local_98);
      }
    } while (local_98.m_IP <
             (int)((ulong)((long)((local_98.m_Parent)->m_Instructions).
                                 super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)((local_98.m_Parent)->m_Instructions).
                                super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  VMState::PrintOutput(&local_98,out,n);
  if (local_98.m_JNZInstructions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.m_JNZInstructions.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.m_JNZInstructions.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.m_JNZInstructions.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::~vector
            (&local_98.m_Stack);
  if (local_98.m_Block.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.m_Block.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void NutFunction::GenerateBodySource( int n, std::ostream& out ) const
{
	//for( auto i = m_Functions.begin(); i != m_Functions.end(); ++i)
	//	i->GenerateFunctionSource(n, out, extraInfo);

	if (m_IsGenerator)
		out << indent(n) << "// Function is a generator." << std::endl;

	if (g_DebugMode)
	{
		out << indent(n) << "// Defaults:" << std::endl;
		for( std::vector<int>::const_iterator i = m_DefaultParams.begin(); i != m_DefaultParams.end(); ++i)
			out << indent(n) << "//\t" << *i << std::endl;
		
		out << std::endl;

		out << indent(n) << "// Literals:" << std::endl;
		for( std::vector<SqObject>::const_iterator i = m_Literals.begin(); i != m_Literals.end(); ++i)
			out << indent(n) << "//\t" << *i << std::endl;

		out << std::endl;

		out << indent(n) << "// Outer values:" << std::endl;
		for( vector<OuterValueInfo>::const_iterator i = m_OuterValues.begin(); i != m_OuterValues.end(); ++i)
			out << indent(n) << "//\t" << i->type << "  src=" << i->src << "  name=" << i->name << std::endl; 

		out << std::endl;

		out << indent(n) << "// Local identifiers:" << std::endl;
		for(vector<NutFunction::LocalVarInfo>::const_reverse_iterator i = m_Locals.rbegin(); i != m_Locals.rend(); ++i)
		{
			out << indent(n) << "//   -" << i->name << spaces(10 - i->name.size()) 
				<< " // pos=" << i->pos << "  start=" << i->start_op << "  end=" << i->end_op << (i->foreachLoopState ? " foreach state" : "") << std::endl;
		}

		out << std::endl;
		out << indent(n) << "// Instructions:" << std::endl;

		int64_t currentLine = 0;
		vector<LineInfo>::const_iterator lineInfo = m_LineInfos.begin();

		for(size_t i = 0; i < m_Instructions.size(); ++i)
		{
			while (lineInfo != m_LineInfos.end() && i >= (unsigned int)lineInfo->op)
			{
				currentLine = lineInfo->line;
				++lineInfo;
			}

			out << indent(n) << "// " << std::setfill(' ') << std::setw(5) << currentLine << "  ";
			PrintOpcode(out, (int)i, m_Instructions[i]);
			out << std::endl;
		}

		out << indent(n) << std::endl;
		out << indent(n) << "// Decompilation attempt:" << std::endl;
	}

	// Crate new state for decompiler virtual machine
	VMState state(*this, m_StackSize);

	// Set initial stack elements to local identifiers
	for(vector<NutFunction::LocalVarInfo>::const_reverse_iterator i = m_Locals.rbegin(); i != m_Locals.rend(); ++i)	
		if (i->start_op == 0 && !i->foreachLoopState)
			state.AtStack(i->pos) = ExpressionPtr(new LocalVariableExpression(i->name));

	// Decompiler loop
	while(!state.EndOfInstructions())
	{
		if (m_Instructions[state.IP()].op == OP_RETURN && (state.IP() == m_Instructions.size() - 1) && m_Instructions[state.IP()].arg0 == -1)
		{
			// This is last return statement in function - can be skipped
			state.NextInstruction();
			continue;	
		}

		DecompileStatement(state);
	}

	// Print decompiled code
	state.PrintOutput(out, n);
}